

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

int __thiscall QSpanData::init(QSpanData *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  long lVar2;
  QClipData *pQVar3;
  long in_RDX;
  
  this->rasterBuffer = (QRasterBuffer *)ctx;
  *(undefined2 *)&this->field_0x88 = 0;
  this->bilinear = false;
  lVar2 = 0;
  this->m33 = 1.0;
  this->m11 = 1.0;
  this->m22 = 1.0;
  this->m23 = 0.0;
  this->m12 = 0.0;
  this->m13 = 0.0;
  this->m21 = 0.0;
  this->dx = 0.0;
  this->dy = 0.0;
  if (in_RDX == 0) {
    pQVar3 = (QClipData *)0x0;
  }
  else {
    lVar2 = *(long *)(in_RDX + 0x18);
    lVar1 = *(long *)(*(long *)(lVar2 + 0x10) + 8);
    if (((lVar1 == 0) || (pQVar3 = *(QClipData **)(lVar1 + 0x400), pQVar3 == (QClipData *)0x0)) ||
       ((pQVar3->field_0x48 & 1) == 0)) {
      pQVar3 = *(QClipData **)(lVar2 + 0x650);
    }
  }
  this->clip = pQVar3;
  return (int)lVar2;
}

Assistant:

void QSpanData::init(QRasterBuffer *rb, const QRasterPaintEngine *pe)
{
    rasterBuffer = rb;
    type = None;
    txop = 0;
    bilinear = false;
    m11 = m22 = m33 = 1.;
    m12 = m13 = m21 = m23 = dx = dy = 0.0;
    clip = pe ? pe->d_func()->clip() : nullptr;
}